

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

bool __thiscall cmStateSnapshot::RaiseScope(cmStateSnapshot *this,string *var,char *varDef)

{
  PositionType *pPVar1;
  iterator other;
  StackIter begin;
  StackIter end;
  bool bVar2;
  PointerType pSVar3;
  PointerType pSVar4;
  PointerType this_00;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  cmStateSnapshot parentDir;
  char *varDef_local;
  string *var_local;
  cmStateSnapshot *this_local;
  
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pPVar1 = &pSVar4->DirectoryParent;
  parentDir.Position.Position = (PositionType)pPVar1->Tree;
  other.Tree = pPVar1->Tree;
  other.Position = pPVar1->Position;
  bVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==
                    (&pSVar3->ScopeParent,other);
  if (bVar2) {
    GetBuildsystemDirectoryParent((cmStateSnapshot *)local_50,this);
    bVar2 = IsValid((cmStateSnapshot *)local_50);
    if (bVar2) {
      if (varDef == (char *)0x0) {
        RemoveDefinition((cmStateSnapshot *)local_50,var);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,varDef,&local_71);
        SetDefinition((cmStateSnapshot *)local_50,var,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator(&local_71);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
    begin.Tree = (pSVar3->Vars).Tree;
    begin.Position = (pSVar3->Vars).Position;
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
    end.Tree = (pSVar3->Root).Tree;
    end.Position = (pSVar3->Root).Position;
    cmDefinitions::Raise(var,begin,end);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
    this_00 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar3->Parent);
    cmDefinitions::Set(this_00,var,varDef);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmStateSnapshot::RaiseScope(std::string const& var, const char* varDef)
{
  if (this->Position->ScopeParent == this->Position->DirectoryParent) {
    cmStateSnapshot parentDir = this->GetBuildsystemDirectoryParent();
    if (!parentDir.IsValid()) {
      return false;
    }
    // Update the definition in the parent directory top scope.  This
    // directory's scope was initialized by the closure of the parent
    // scope, so we do not need to localize the definition first.
    if (varDef) {
      parentDir.SetDefinition(var, varDef);
    } else {
      parentDir.RemoveDefinition(var);
    }
    return true;
  }
  // First localize the definition in the current scope.
  cmDefinitions::Raise(var, this->Position->Vars, this->Position->Root);

  // Now update the definition in the parent scope.
  this->Position->Parent->Set(var, varDef);
  return true;
}